

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

void __thiscall
google::protobuf::SourceCodeInfo_Location::_internal_add_path
          (SourceCodeInfo_Location *this,int32 value)

{
  int local_4;
  
  RepeatedField<int>::Add(&this->path_,&local_4);
  return;
}

Assistant:

inline void SourceCodeInfo_Location::_internal_add_path(::PROTOBUF_NAMESPACE_ID::int32 value) {
  path_.Add(value);
}